

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O2

void __thiscall
amrex::FaceLinear::interp_arr
          (FaceLinear *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_9,Geometry *param_10,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_11,int param_12,int param_13,RunOn runon)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  uint uVar5;
  IndexType IVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  int *piVar19;
  double *pdVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined8 *puVar25;
  uint uVar26;
  int i_2;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  double dVar30;
  Box bx_2;
  Box bx_1;
  Box bx;
  Array<IndexType,_3> types;
  GpuArray<amrex::Array4<double>,_3U> fine_arr;
  GpuArray<amrex::Array4<const_int>,_3U> mask_arr;
  GpuArray<amrex::Array4<const_double>,_3U> crse_arr;
  
  types._M_elems[2].itype = 0;
  types._M_elems[0].itype = 0;
  types._M_elems[1].itype = 0;
  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
    types._M_elems[lVar12].itype = types._M_elems[lVar12].itype | 1 << ((byte)lVar12 & 0x1f);
  }
  GpuArray<amrex::Array4<const_double>,_3U>::GpuArray(&crse_arr);
  GpuArray<amrex::Array4<double>,_3U>::GpuArray(&fine_arr);
  GpuArray<amrex::Array4<const_int>,_3U>::GpuArray(&mask_arr);
  for (lVar12 = 0; lVar12 != 0x18; lVar12 = lVar12 + 8) {
    lVar28 = *(long *)((long)crse->_M_elems + lVar12);
    iVar1 = *(int *)(lVar28 + 0x20);
    uVar3 = *(undefined8 *)(lVar28 + 0x18);
    lVar21 = (long)*(int *)(lVar28 + 0x28) + 1;
    iVar11 = *(int *)(lVar28 + 0x24);
    lVar24 = (long)*(int *)(lVar28 + 0x2c) + 1;
    lVar17 = ((long)iVar11 - (long)*(int *)(lVar28 + 0x18)) + 1;
    lVar22 = (lVar21 - *(int *)(lVar28 + 0x1c)) * lVar17;
    lVar23 = (lVar24 - iVar1) * lVar22;
    iVar2 = *(int *)(lVar28 + 0x34);
    (&crse_arr.arr[0].p)[lVar12] = (double *)(lVar23 * crse_comp * 8 + *(long *)(lVar28 + 0x10));
    (&crse_arr.arr[0].jstride)[lVar12] = lVar17;
    (&crse_arr.arr[0].kstride)[lVar12] = lVar22;
    (&crse_arr.arr[0].nstride)[lVar12] = lVar23;
    *(undefined8 *)(&crse_arr.arr[0].begin.x + lVar12 * 2) = uVar3;
    (&crse_arr.arr[0].begin.z)[lVar12 * 2] = iVar1;
    *(ulong *)(&crse_arr.arr[0].end.x + lVar12 * 2) = (ulong)(iVar11 + 1) | lVar21 << 0x20;
    (&crse_arr.arr[0].end.z)[lVar12 * 2] = (int)lVar24;
    (&crse_arr.arr[0].ncomp)[lVar12 * 2] = iVar2 - crse_comp;
    lVar28 = *(long *)((long)fine->_M_elems + lVar12);
    iVar1 = *(int *)(lVar28 + 0x20);
    uVar3 = *(undefined8 *)(lVar28 + 0x18);
    lVar21 = (long)*(int *)(lVar28 + 0x28) + 1;
    iVar11 = *(int *)(lVar28 + 0x24);
    lVar24 = (long)*(int *)(lVar28 + 0x2c) + 1;
    lVar17 = ((long)iVar11 - (long)*(int *)(lVar28 + 0x18)) + 1;
    lVar22 = (lVar21 - *(int *)(lVar28 + 0x1c)) * lVar17;
    lVar23 = (lVar24 - iVar1) * lVar22;
    iVar2 = *(int *)(lVar28 + 0x34);
    (&fine_arr.arr[0].p)[lVar12] = (double *)(lVar23 * fine_comp * 8 + *(long *)(lVar28 + 0x10));
    (&fine_arr.arr[0].jstride)[lVar12] = lVar17;
    (&fine_arr.arr[0].kstride)[lVar12] = lVar22;
    (&fine_arr.arr[0].nstride)[lVar12] = lVar23;
    *(undefined8 *)(&fine_arr.arr[0].begin.x + lVar12 * 2) = uVar3;
    (&fine_arr.arr[0].begin.z)[lVar12 * 2] = iVar1;
    *(ulong *)(&fine_arr.arr[0].end.x + lVar12 * 2) = (ulong)(iVar11 + 1) | lVar21 << 0x20;
    (&fine_arr.arr[0].end.z)[lVar12 * 2] = (int)lVar24;
    (&fine_arr.arr[0].ncomp)[lVar12 * 2] = iVar2 - fine_comp;
    lVar28 = *(long *)((long)solve_mask->_M_elems + lVar12);
    if (lVar28 != 0) {
      iVar1 = *(int *)(lVar28 + 0x34);
      iVar11 = *(int *)(lVar28 + 0x20);
      uVar3 = *(undefined8 *)(lVar28 + 0x18);
      lVar17 = (long)*(int *)(lVar28 + 0x28) + 1;
      iVar2 = *(int *)(lVar28 + 0x24);
      lVar23 = (long)*(int *)(lVar28 + 0x2c) + 1;
      lVar22 = ((long)iVar2 - (long)*(int *)(lVar28 + 0x18)) + 1;
      lVar21 = (lVar17 - *(int *)(lVar28 + 0x1c)) * lVar22;
      (&mask_arr.arr[0].p)[lVar12] = *(int **)(lVar28 + 0x10);
      (&mask_arr.arr[0].jstride)[lVar12] = lVar22;
      (&mask_arr.arr[0].kstride)[lVar12] = lVar21;
      (&mask_arr.arr[0].nstride)[lVar12] = (lVar23 - iVar11) * lVar21;
      *(undefined8 *)(&mask_arr.arr[0].begin.x + lVar12 * 2) = uVar3;
      (&mask_arr.arr[0].begin.z)[lVar12 * 2] = iVar11;
      *(ulong *)(&mask_arr.arr[0].end.x + lVar12 * 2) = (ulong)(iVar2 + 1) | lVar17 << 0x20;
      (&mask_arr.arr[0].end.z)[lVar12 * 2] = (int)lVar23;
      (&mask_arr.arr[0].ncomp)[lVar12 * 2] = iVar1;
    }
  }
  uVar14 = *(ulong *)(fine_region->smallend).vect;
  uVar3 = *(undefined8 *)((fine_region->smallend).vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  bx.smallend.vect[2] = (int)uVar3;
  bx.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar12 = 0; uVar7 = (uint)lVar12, lVar12 != 3; lVar12 = lVar12 + 1) {
    uVar5 = 1 << ((byte)lVar12 & 0x1f);
    bx.bigend.vect[lVar12] =
         (bx.bigend.vect[lVar12] + (uint)((types._M_elems[0].itype >> (uVar7 & 0x1f) & 1) != 0)) -
         (uint)((bx.btype.itype >> (uVar7 & 0x1f) & 1) != 0);
    if ((types._M_elems[0].itype >> (uVar7 & 0x1f) & 1) == 0) {
      IVar6.itype = ~uVar5 & bx.btype.itype;
    }
    else {
      IVar6.itype = uVar5 | bx.btype.itype;
    }
    bx.btype.itype = IVar6.itype;
  }
  uVar10 = *(ulong *)(fine_region->smallend).vect;
  uVar3 = *(undefined8 *)((fine_region->smallend).vect + 2);
  bx_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  bx_1._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  bx_1.smallend.vect[2] = (int)uVar3;
  bx_1.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar12 = 0; uVar7 = (uint)lVar12, lVar12 != 3; lVar12 = lVar12 + 1) {
    uVar5 = 1 << ((byte)lVar12 & 0x1f);
    bx_1.bigend.vect[lVar12] =
         (bx_1.bigend.vect[lVar12] + (uint)((types._M_elems[1].itype >> (uVar7 & 0x1f) & 1) != 0)) -
         (uint)((bx_1.btype.itype >> (uVar7 & 0x1f) & 1) != 0);
    if ((types._M_elems[1].itype >> (uVar7 & 0x1f) & 1) == 0) {
      IVar6.itype = ~uVar5 & bx_1.btype.itype;
    }
    else {
      IVar6.itype = uVar5 | bx_1.btype.itype;
    }
    bx_1.btype.itype = IVar6.itype;
  }
  uVar4 = *(ulong *)(fine_region->smallend).vect;
  uVar3 = *(undefined8 *)((fine_region->smallend).vect + 2);
  bx_2.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  bx_2._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  bx_2.smallend.vect[2] = (int)uVar3;
  bx_2.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
    uVar7 = 1 << ((byte)lVar12 & 0x1f);
    uVar5 = (uint)lVar12;
    bx_2.bigend.vect[lVar12] =
         (bx_2.bigend.vect[lVar12] + (uint)((types._M_elems[2].itype >> (uVar5 & 0x1f) & 1) != 0)) -
         (uint)((bx_2.btype.itype >> (uVar5 & 0x1f) & 1) != 0);
    if ((types._M_elems[2].itype >> (uVar5 & 0x1f) & 1) == 0) {
      IVar6.itype = ~uVar7 & bx_2.btype.itype;
    }
    else {
      IVar6.itype = uVar7 | bx_2.btype.itype;
    }
    bx_2.btype.itype = IVar6.itype;
  }
  bx.smallend.vect[0] = (int)uVar14;
  bx.smallend.vect[1] = (int)(uVar14 >> 0x20);
  uVar18 = (ulong)bx.smallend.vect[2];
  uVar7 = 0;
  if (0 < ncomp) {
    uVar7 = ncomp;
  }
  uVar9 = (ulong)uVar7;
  for (; uVar7 = (uint)uVar18, (int)uVar7 <= bx.bigend.vect[2]; uVar18 = uVar18 + 1) {
    for (uVar13 = (long)bx.smallend.vect[1]; uVar5 = (uint)uVar13, (int)uVar5 <= bx.bigend.vect[1];
        uVar13 = uVar13 + 1) {
      uVar27 = uVar14 & 0xffffffff;
      lVar12 = (long)bx.smallend.vect[0] << 3;
      while (uVar16 = (uint)uVar27, (int)uVar16 <= bx.bigend.vect[0]) {
        iVar1 = ratio->vect[0];
        pdVar20 = crse_arr.arr[0].p + -(long)crse_arr.arr[0].begin.x;
        piVar19 = mask_arr.arr[0].p + -(long)mask_arr.arr[0].begin.x;
        puVar25 = (undefined8 *)
                  (lVar12 + (uVar18 - (long)fine_arr.arr[0].begin.z) * fine_arr.arr[0].kstride * 8 +
                   (uVar13 - (long)fine_arr.arr[0].begin.y) * fine_arr.arr[0].jstride * 8 +
                   (long)fine_arr.arr[0].begin.x * -8 + (long)fine_arr.arr[0].p);
        iVar11 = ratio->vect[1];
        iVar2 = ratio->vect[2];
        uVar27 = uVar9;
        while (bVar29 = uVar27 != 0, uVar27 = uVar27 - 1, bVar29) {
          uVar26 = uVar16;
          if (((iVar1 != 1) && (uVar26 = (int)uVar16 >> 2, iVar1 != 4)) &&
             (uVar26 = (int)uVar16 >> 1, iVar1 != 2)) {
            if ((int)uVar16 < 0) {
              uVar26 = ~((int)~uVar16 / iVar1);
            }
            else {
              uVar26 = (int)uVar16 / iVar1;
            }
          }
          if (uVar26 * iVar1 == uVar16) {
            uVar15 = uVar5;
            if (((iVar11 != 1) && (uVar15 = (int)uVar5 >> 2, iVar11 != 4)) &&
               (uVar15 = (int)uVar5 >> 1, iVar11 != 2)) {
              if ((int)uVar5 < 0) {
                uVar15 = ~((int)~uVar5 / iVar11);
              }
              else {
                uVar15 = (uint)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                      uVar13 & 0xffffffff) / (long)iVar11);
              }
            }
            uVar8 = uVar7;
            if (((iVar2 != 1) && (uVar8 = (int)uVar7 >> 2, iVar2 != 4)) &&
               (uVar8 = (int)uVar7 >> 1, iVar2 != 2)) {
              if ((int)uVar7 < 0) {
                uVar8 = ~((int)~uVar7 / iVar2);
              }
              else {
                uVar8 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 |
                                     uVar18 & 0xffffffff) / (long)iVar2);
              }
            }
            if ((mask_arr.arr[0].p == (int *)0x0) ||
               (*(int *)((long)piVar19 +
                        ((long)(int)uVar8 - (long)mask_arr.arr[0].begin.z) *
                        mask_arr.arr[0].kstride * 4 +
                        ((long)(int)uVar15 - (long)mask_arr.arr[0].begin.y) *
                        mask_arr.arr[0].jstride * 4 + (long)(int)uVar26 * 4) != 0)) {
              *puVar25 = *(undefined8 *)
                          ((long)pdVar20 +
                          (long)(int)uVar26 * 8 +
                          ((long)(int)uVar8 - (long)crse_arr.arr[0].begin.z) *
                          crse_arr.arr[0].kstride * 8 +
                          ((long)(int)uVar15 - (long)crse_arr.arr[0].begin.y) *
                          crse_arr.arr[0].jstride * 8);
            }
          }
          puVar25 = puVar25 + fine_arr.arr[0].nstride;
          pdVar20 = pdVar20 + crse_arr.arr[0].nstride;
          piVar19 = piVar19 + mask_arr.arr[0].nstride;
        }
        lVar12 = lVar12 + 8;
        uVar27 = (ulong)(uVar16 + 1);
      }
    }
  }
  bx_1.smallend.vect[0] = (int)uVar10;
  bx_1.smallend.vect[1] = (int)(uVar10 >> 0x20);
  for (uVar14 = (ulong)bx_1.smallend.vect[2]; uVar7 = (uint)uVar14,
      (int)uVar7 <= bx_1.bigend.vect[2]; uVar14 = uVar14 + 1) {
    for (uVar18 = (long)bx_1.smallend.vect[1]; uVar5 = (uint)uVar18,
        (int)uVar5 <= bx_1.bigend.vect[1]; uVar18 = uVar18 + 1) {
      uVar13 = uVar10 & 0xffffffff;
      lVar12 = (long)bx_1.smallend.vect[0] << 3;
      while (uVar16 = (uint)uVar13, (int)uVar16 <= bx_1.bigend.vect[0]) {
        iVar1 = ratio->vect[0];
        pdVar20 = crse_arr.arr[1].p + -(long)crse_arr.arr[1].begin.x;
        piVar19 = mask_arr.arr[1].p + -(long)mask_arr.arr[1].begin.x;
        puVar25 = (undefined8 *)
                  (lVar12 + (uVar14 - (long)fine_arr.arr[1].begin.z) * fine_arr.arr[1].kstride * 8 +
                   (uVar18 - (long)fine_arr.arr[1].begin.y) * fine_arr.arr[1].jstride * 8 +
                   (long)fine_arr.arr[1].begin.x * -8 + (long)fine_arr.arr[1].p);
        iVar11 = ratio->vect[1];
        iVar2 = ratio->vect[2];
        uVar13 = uVar9;
        while (bVar29 = uVar13 != 0, uVar13 = uVar13 - 1, bVar29) {
          uVar26 = uVar5;
          if (((iVar11 != 1) && (uVar26 = (int)uVar5 >> 2, iVar11 != 4)) &&
             (uVar26 = (int)uVar5 >> 1, iVar11 != 2)) {
            if ((int)uVar5 < 0) {
              uVar26 = ~((int)~uVar5 / iVar11);
            }
            else {
              uVar26 = (uint)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar18 & 0xffffffff
                                    ) / (long)iVar11);
            }
          }
          if (uVar26 * iVar11 == uVar5) {
            uVar15 = uVar16;
            if (((iVar1 != 1) && (uVar15 = (int)uVar16 >> 2, iVar1 != 4)) &&
               (uVar15 = (int)uVar16 >> 1, iVar1 != 2)) {
              if ((int)uVar16 < 0) {
                uVar15 = ~((int)~uVar16 / iVar1);
              }
              else {
                uVar15 = (int)uVar16 / iVar1;
              }
            }
            uVar8 = uVar7;
            if (((iVar2 != 1) && (uVar8 = (int)uVar7 >> 2, iVar2 != 4)) &&
               (uVar8 = (int)uVar7 >> 1, iVar2 != 2)) {
              if ((int)uVar7 < 0) {
                uVar8 = ~((int)~uVar7 / iVar2);
              }
              else {
                uVar8 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 |
                                     uVar14 & 0xffffffff) / (long)iVar2);
              }
            }
            if ((mask_arr.arr[1].p == (int *)0x0) ||
               (*(int *)((long)piVar19 +
                        ((long)(int)uVar8 - (long)mask_arr.arr[1].begin.z) *
                        mask_arr.arr[1].kstride * 4 +
                        ((long)(int)uVar26 - (long)mask_arr.arr[1].begin.y) *
                        mask_arr.arr[1].jstride * 4 + (long)(int)uVar15 * 4) != 0)) {
              *puVar25 = *(undefined8 *)
                          ((long)pdVar20 +
                          ((long)(int)uVar8 - (long)crse_arr.arr[1].begin.z) *
                          crse_arr.arr[1].kstride * 8 +
                          ((long)(int)uVar26 - (long)crse_arr.arr[1].begin.y) *
                          crse_arr.arr[1].jstride * 8 + (long)(int)uVar15 * 8);
            }
          }
          puVar25 = puVar25 + fine_arr.arr[1].nstride;
          pdVar20 = pdVar20 + crse_arr.arr[1].nstride;
          piVar19 = piVar19 + mask_arr.arr[1].nstride;
        }
        lVar12 = lVar12 + 8;
        uVar13 = (ulong)(uVar16 + 1);
      }
    }
  }
  bx_2.smallend.vect[0] = (int)uVar4;
  bx_2.smallend.vect[1] = (int)(uVar4 >> 0x20);
  for (uVar14 = (ulong)bx_2.smallend.vect[2]; uVar7 = (uint)uVar14,
      (int)uVar7 <= bx_2.bigend.vect[2]; uVar14 = uVar14 + 1) {
    for (uVar10 = (long)bx_2.smallend.vect[1]; uVar5 = (uint)uVar10,
        (int)uVar5 <= bx_2.bigend.vect[1]; uVar10 = uVar10 + 1) {
      uVar18 = uVar4 & 0xffffffff;
      lVar12 = (long)bx_2.smallend.vect[0] << 3;
      while (uVar16 = (uint)uVar18, (int)uVar16 <= bx_2.bigend.vect[0]) {
        iVar1 = ratio->vect[2];
        pdVar20 = crse_arr.arr[2].p + -(long)crse_arr.arr[2].begin.x;
        piVar19 = mask_arr.arr[2].p + -(long)mask_arr.arr[2].begin.x;
        puVar25 = (undefined8 *)
                  (lVar12 + (uVar14 - (long)fine_arr.arr[2].begin.z) * fine_arr.arr[2].kstride * 8 +
                   (uVar10 - (long)fine_arr.arr[2].begin.y) * fine_arr.arr[2].jstride * 8 +
                   (long)fine_arr.arr[2].begin.x * -8 + (long)fine_arr.arr[2].p);
        iVar11 = ratio->vect[0];
        iVar2 = ratio->vect[1];
        uVar18 = uVar9;
        while (bVar29 = uVar18 != 0, uVar18 = uVar18 - 1, bVar29) {
          uVar26 = uVar7;
          if (((iVar1 != 1) && (uVar26 = (int)uVar7 >> 2, iVar1 != 4)) &&
             (uVar26 = (int)uVar7 >> 1, iVar1 != 2)) {
            if ((int)uVar7 < 0) {
              uVar26 = ~((int)~uVar7 / iVar1);
            }
            else {
              uVar26 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar14 & 0xffffffff
                                    ) / (long)iVar1);
            }
          }
          if (uVar26 * iVar1 == uVar7) {
            uVar15 = uVar16;
            if (((iVar11 != 1) && (uVar15 = (int)uVar16 >> 2, iVar11 != 4)) &&
               (uVar15 = (int)uVar16 >> 1, iVar11 != 2)) {
              if ((int)uVar16 < 0) {
                uVar15 = ~((int)~uVar16 / iVar11);
              }
              else {
                uVar15 = (int)uVar16 / iVar11;
              }
            }
            uVar8 = uVar5;
            if (((iVar2 != 1) && (uVar8 = (int)uVar5 >> 2, iVar2 != 4)) &&
               (uVar8 = (int)uVar5 >> 1, iVar2 != 2)) {
              if ((int)uVar5 < 0) {
                uVar8 = ~((int)~uVar5 / iVar2);
              }
              else {
                uVar8 = (uint)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 |
                                     uVar10 & 0xffffffff) / (long)iVar2);
              }
            }
            if ((mask_arr.arr[2].p == (int *)0x0) ||
               (*(int *)((long)piVar19 +
                        ((long)(int)uVar26 - (long)mask_arr.arr[2].begin.z) *
                        mask_arr.arr[2].kstride * 4 +
                        ((long)(int)uVar8 - (long)mask_arr.arr[2].begin.y) *
                        mask_arr.arr[2].jstride * 4 + (long)(int)uVar15 * 4) != 0)) {
              *puVar25 = *(undefined8 *)
                          ((long)pdVar20 +
                          (long)(int)uVar15 * 8 +
                          ((long)(int)uVar26 - (long)crse_arr.arr[2].begin.z) *
                          crse_arr.arr[2].kstride * 8 +
                          ((long)(int)uVar8 - (long)crse_arr.arr[2].begin.y) *
                          crse_arr.arr[2].jstride * 8);
            }
          }
          puVar25 = puVar25 + fine_arr.arr[2].nstride;
          pdVar20 = pdVar20 + crse_arr.arr[2].nstride;
          piVar19 = piVar19 + mask_arr.arr[2].nstride;
        }
        lVar12 = lVar12 + 8;
        uVar18 = (ulong)(uVar16 + 1);
      }
    }
  }
  uVar14 = *(ulong *)(fine_region->smallend).vect;
  uVar3 = *(undefined8 *)((fine_region->smallend).vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  bx.smallend.vect[2] = (int)uVar3;
  bx.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar12 = 0; uVar7 = (uint)lVar12, lVar12 != 3; lVar12 = lVar12 + 1) {
    uVar5 = 1 << ((byte)lVar12 & 0x1f);
    bx.bigend.vect[lVar12] =
         (bx.bigend.vect[lVar12] + (uint)((types._M_elems[0].itype >> (uVar7 & 0x1f) & 1) != 0)) -
         (uint)((bx.btype.itype >> (uVar7 & 0x1f) & 1) != 0);
    if ((types._M_elems[0].itype >> (uVar7 & 0x1f) & 1) == 0) {
      IVar6.itype = ~uVar5 & bx.btype.itype;
    }
    else {
      IVar6.itype = uVar5 | bx.btype.itype;
    }
    bx.btype.itype = IVar6.itype;
  }
  uVar10 = *(ulong *)(fine_region->smallend).vect;
  uVar3 = *(undefined8 *)((fine_region->smallend).vect + 2);
  bx_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  bx_1._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  bx_1.smallend.vect[2] = (int)uVar3;
  bx_1.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar12 = 0; uVar7 = (uint)lVar12, lVar12 != 3; lVar12 = lVar12 + 1) {
    uVar5 = 1 << ((byte)lVar12 & 0x1f);
    bx_1.bigend.vect[lVar12] =
         (bx_1.bigend.vect[lVar12] + (uint)((types._M_elems[1].itype >> (uVar7 & 0x1f) & 1) != 0)) -
         (uint)((bx_1.btype.itype >> (uVar7 & 0x1f) & 1) != 0);
    if ((types._M_elems[1].itype >> (uVar7 & 0x1f) & 1) == 0) {
      IVar6.itype = ~uVar5 & bx_1.btype.itype;
    }
    else {
      IVar6.itype = uVar5 | bx_1.btype.itype;
    }
    bx_1.btype.itype = IVar6.itype;
  }
  uVar4 = *(ulong *)(fine_region->smallend).vect;
  uVar3 = *(undefined8 *)((fine_region->smallend).vect + 2);
  bx_2.bigend.vect[1] = (int)((ulong)*(undefined8 *)(fine_region->bigend).vect >> 0x20);
  bx_2._20_8_ = *(undefined8 *)((fine_region->bigend).vect + 2);
  bx_2.smallend.vect[2] = (int)uVar3;
  bx_2.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
    uVar7 = 1 << ((byte)lVar12 & 0x1f);
    uVar5 = (uint)lVar12;
    bx_2.bigend.vect[lVar12] =
         (bx_2.bigend.vect[lVar12] + (uint)((types._M_elems[2].itype >> (uVar5 & 0x1f) & 1) != 0)) -
         (uint)((bx_2.btype.itype >> (uVar5 & 0x1f) & 1) != 0);
    if ((types._M_elems[2].itype >> (uVar5 & 0x1f) & 1) == 0) {
      IVar6.itype = ~uVar7 & bx_2.btype.itype;
    }
    else {
      IVar6.itype = uVar7 | bx_2.btype.itype;
    }
    bx_2.btype.itype = IVar6.itype;
  }
  bx.smallend.vect[0] = (int)uVar14;
  bx.smallend.vect[1] = (int)(uVar14 >> 0x20);
  for (lVar12 = (long)bx.smallend.vect[2]; lVar28 = (long)bx.smallend.vect[1],
      (int)lVar12 <= bx.bigend.vect[2]; lVar12 = lVar12 + 1) {
    while( true ) {
      uVar18 = uVar14 & 0xffffffff;
      lVar17 = (long)bx.smallend.vect[0] << 3;
      if (bx.bigend.vect[1] < (int)lVar28) break;
      while (uVar7 = (uint)uVar18, (int)uVar7 <= bx.bigend.vect[0]) {
        iVar1 = ratio->vect[0];
        pdVar20 = fine_arr.arr[0].p +
                  (((lVar12 - fine_arr.arr[0].begin.z) * fine_arr.arr[0].kstride +
                   (lVar28 - fine_arr.arr[0].begin.y) * fine_arr.arr[0].jstride) -
                  (long)fine_arr.arr[0].begin.x);
        uVar18 = uVar9;
        while (bVar29 = uVar18 != 0, uVar18 = uVar18 - 1, bVar29) {
          uVar5 = uVar7;
          if (((iVar1 != 1) && (uVar5 = (int)uVar7 >> 2, iVar1 != 4)) &&
             (uVar5 = (int)uVar7 >> 1, iVar1 != 2)) {
            if ((int)uVar7 < 0) {
              uVar5 = ~((int)~uVar7 / iVar1);
            }
            else {
              uVar5 = (int)uVar7 / iVar1;
            }
          }
          iVar11 = uVar7 - uVar5 * iVar1;
          if (iVar11 != 0) {
            dVar30 = (double)iVar11 * (1.0 / (double)iVar1);
            *(double *)((long)pdVar20 + lVar17) =
                 (1.0 - dVar30) * pdVar20[(int)(uVar5 * iVar1)] +
                 dVar30 * pdVar20[(int)((uVar5 + 1) * iVar1)];
          }
          pdVar20 = pdVar20 + fine_arr.arr[0].nstride;
        }
        lVar17 = lVar17 + 8;
        uVar18 = (ulong)(uVar7 + 1);
      }
      lVar28 = lVar28 + 1;
    }
  }
  bx_1.smallend.vect[0] = (int)uVar10;
  bx_1.smallend.vect[1] = (int)(uVar10 >> 0x20);
  lVar12 = (long)bx_1.smallend.vect[2];
  while( true ) {
    uVar14 = (long)bx_1.smallend.vect[1];
    if (bx_1.bigend.vect[2] < (int)lVar12) break;
    for (; uVar7 = (uint)uVar14, (int)uVar7 <= bx_1.bigend.vect[1]; uVar14 = uVar14 + 1) {
      lVar28 = (long)bx_1.smallend.vect[0] << 3;
      for (uVar18 = uVar10 & 0xffffffff; (int)uVar18 <= bx_1.bigend.vect[0];
          uVar18 = (ulong)((int)uVar18 + 1)) {
        iVar1 = ratio->vect[1];
        lVar17 = fine_arr.arr[1].jstride * 8;
        lVar21 = lVar28 + (lVar12 - fine_arr.arr[1].begin.z) * fine_arr.arr[1].kstride * 8 +
                 (long)fine_arr.arr[1].begin.x * -8 + (long)fine_arr.arr[1].p;
        uVar13 = uVar9;
        while (bVar29 = uVar13 != 0, uVar13 = uVar13 - 1, bVar29) {
          uVar5 = uVar7;
          if (((iVar1 != 1) && (uVar5 = (int)uVar7 >> 2, iVar1 != 4)) &&
             (uVar5 = (int)uVar7 >> 1, iVar1 != 2)) {
            if ((int)uVar7 < 0) {
              uVar5 = ~((int)~uVar7 / iVar1);
            }
            else {
              uVar5 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar14 & 0xffffffff)
                            / (long)iVar1);
            }
          }
          iVar11 = uVar7 - uVar5 * iVar1;
          if (iVar11 != 0) {
            dVar30 = (double)iVar11 * (1.0 / (double)iVar1);
            *(double *)(lVar21 + (uVar14 - (long)fine_arr.arr[1].begin.y) * lVar17) =
                 (1.0 - dVar30) *
                 *(double *)(lVar21 + (int)(uVar5 * iVar1 - fine_arr.arr[1].begin.y) * lVar17) +
                 dVar30 * *(double *)
                           (lVar21 + (int)((uVar5 + 1) * iVar1 - fine_arr.arr[1].begin.y) * lVar17);
          }
          lVar21 = lVar21 + fine_arr.arr[1].nstride * 8;
        }
        lVar28 = lVar28 + 8;
      }
    }
    lVar12 = lVar12 + 1;
  }
  bx_2.smallend.vect[0] = (int)uVar4;
  bx_2.smallend.vect[1] = (int)(uVar4 >> 0x20);
  for (uVar14 = (ulong)bx_2.smallend.vect[2]; uVar7 = (uint)uVar14,
      (int)uVar7 <= bx_2.bigend.vect[2]; uVar14 = uVar14 + 1) {
    lVar12 = (long)bx_2.smallend.vect[1];
    while( true ) {
      uVar10 = uVar4 & 0xffffffff;
      lVar28 = (long)bx_2.smallend.vect[0] << 3;
      if (bx_2.bigend.vect[1] < (int)lVar12) break;
      for (; (int)uVar10 <= bx_2.bigend.vect[0]; uVar10 = (ulong)((int)uVar10 + 1)) {
        iVar1 = ratio->vect[2];
        lVar17 = fine_arr.arr[2].kstride * 8;
        lVar21 = lVar28 + (lVar12 - fine_arr.arr[2].begin.y) * fine_arr.arr[2].jstride * 8 +
                 (long)fine_arr.arr[2].begin.x * -8 + (long)fine_arr.arr[2].p;
        uVar18 = uVar9;
        while (bVar29 = uVar18 != 0, uVar18 = uVar18 - 1, bVar29) {
          uVar5 = uVar7;
          if (((iVar1 != 1) && (uVar5 = (int)uVar7 >> 2, iVar1 != 4)) &&
             (uVar5 = (int)uVar7 >> 1, iVar1 != 2)) {
            if ((int)uVar7 < 0) {
              uVar5 = ~((int)~uVar7 / iVar1);
            }
            else {
              uVar5 = (uint)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar14 & 0xffffffff)
                            / (long)iVar1);
            }
          }
          iVar11 = uVar7 - uVar5 * iVar1;
          if (iVar11 != 0) {
            dVar30 = (double)iVar11 * (1.0 / (double)iVar1);
            *(double *)(lVar21 + (uVar14 - (long)fine_arr.arr[2].begin.z) * lVar17) =
                 (1.0 - dVar30) *
                 *(double *)(lVar21 + (int)(uVar5 * iVar1 - fine_arr.arr[2].begin.z) * lVar17) +
                 dVar30 * *(double *)
                           (lVar21 + (int)((uVar5 + 1) * iVar1 - fine_arr.arr[2].begin.z) * lVar17);
          }
          lVar21 = lVar21 + fine_arr.arr[2].nstride * 8;
        }
        lVar28 = lVar28 + 8;
      }
      lVar12 = lVar12 + 1;
    }
  }
  return;
}

Assistant:

void FaceLinear::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                             const int         crse_comp,
                             Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                             const int         fine_comp,
                             const int         ncomp,
                             const Box&        fine_region,
                             const IntVect&    ratio,
                             Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                             const Geometry&   /*crse_geom*/,
                             const Geometry&   /*fine_geom*/,
                             Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                             const int         /*actual_comp*/,
                             const int         /*actual_state*/,
                             const RunOn       runon)
{
    BL_PROFILE("FaceLinear::interp_arr()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crse_arr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> fine_arr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> mask_arr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crse_arr[d] = crse[d]->const_array(crse_comp);
        fine_arr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { mask_arr[d] = solve_mask[d]->const_array(0); }
    }

    //
    // Fill fine ghost faces with piecewise-constant interpolation of coarse data.
    // Operate only on faces that overlap--ie, only fill the fine faces that make up each
    // coarse face, leave the in-between faces alone.
    // The mask ensures we do not overwrite valid fine cells.
    //
    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_x(i,j,k,n,fine_arr[0],crse_arr[0],mask_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_y(i,j,k,n,fine_arr[1],crse_arr[1],mask_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_face_interp_z(i,j,k,n,fine_arr[2],crse_arr[2],mask_arr[2],ratio);
                      }
                  });
              });

    //
    // Interpolate unfilled grow cells using best data from
    // surrounding faces of valid region, and pc-interpd data
    // on fine faces overlaying coarse edges.
    //
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_x(i,j,k,n,fine_arr[0],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_y(i,j,k,n,fine_arr[1],ratio);
                      }
                  });
              },
              amrex::convert(fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          face_linear_interp_z(i,j,k,n,fine_arr[2],ratio);
                      }
                  });
              });
}